

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_string(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_attr_chlist_t *peVar1;
  int iVar2;
  int32_t isz;
  
  peVar1 = (a->field_6).chlist;
  if (peVar1->num_channels < 0) {
    iVar2 = (*ctxt->standard_error)(ctxt,3);
  }
  else {
    iVar2 = (*ctxt->do_write)(ctxt,&stack0xffffffffffffffec,4,&ctxt->output_file_offset);
  }
  if (iVar2 == 0) {
    iVar2 = (*ctxt->do_write)(ctxt,peVar1->entries,(long)peVar1->num_channels,
                              &ctxt->output_file_offset);
  }
  return iVar2;
}

Assistant:

static exr_result_t
save_string (struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t       rv;
    exr_attr_string_t* tmp = a->string;

    rv = save_attr_sz (ctxt, (size_t) tmp->length);
    if (rv == EXR_ERR_SUCCESS)
        rv = ctxt->do_write (
            ctxt,
            tmp->str,
            (uint64_t) (tmp->length),
            &(ctxt->output_file_offset));
    return rv;
}